

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

uint glcts::PipelineStatisticsQueryUtilities::getNumberOfVerticesForGSOutput
               (_geometry_shader_output gs_output)

{
  TestError *this;
  uint local_10;
  uint n_result_vertices;
  _geometry_shader_output gs_output_local;
  
  if (gs_output == GEOMETRY_SHADER_OUTPUT_FIRST) {
    local_10 = 1;
  }
  else if (gs_output == GEOMETRY_SHADER_OUTPUT_LINE_STRIP) {
    local_10 = 2;
  }
  else {
    if (gs_output != GEOMETRY_SHADER_OUTPUT_TRIANGLE_STRIP) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Unrecognized geometry shader output type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                 ,0x30f);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_10 = 3;
  }
  return local_10;
}

Assistant:

unsigned int PipelineStatisticsQueryUtilities::getNumberOfVerticesForGSOutput(_geometry_shader_output gs_output)
{
	unsigned int n_result_vertices = 0;

	switch (gs_output)
	{
	case GEOMETRY_SHADER_OUTPUT_LINE_STRIP:
		n_result_vertices = 2;
		break;
	case GEOMETRY_SHADER_OUTPUT_POINTS:
		n_result_vertices = 1;
		break;
	case GEOMETRY_SHADER_OUTPUT_TRIANGLE_STRIP:
		n_result_vertices = 3;
		break;

	default:
		TCU_FAIL("Unrecognized geometry shader output type");
	}

	/* All done */
	return n_result_vertices;
}